

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t Curl_mime_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  _Bool local_39;
  size_t sStack_38;
  _Bool hasread;
  size_t ret;
  curl_mimepart *part;
  void *instream_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  ret = (size_t)instream;
  part = (curl_mimepart *)instream;
  instream_local = (void *)nitems;
  nitems_local = size;
  size_local = (size_t)buffer;
  do {
    local_39 = false;
    sStack_38 = readback_part((curl_mimepart *)ret,(char *)size_local,(size_t)instream_local,
                              &local_39);
  } while (sStack_38 == 0xfffffffffffffffe);
  return sStack_38;
}

Assistant:

size_t Curl_mime_read(char *buffer, size_t size, size_t nitems, void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;
  size_t ret;
  bool hasread;

  (void) size;   /* Always 1. */

  do {
    hasread = FALSE;
    ret = readback_part(part, buffer, nitems, &hasread);
    /*
     * If this is not possible to get some data without calling more than
     * one read callback (probably because a content encoder is not able to
     * deliver a new bunch for the few data accumulated so far), force another
     * read until we get enough data or a special exit code.
     */
  } while(ret == STOP_FILLING);

  return ret;
}